

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void uv__udp_sendmsg(uv_udp_t *handle)

{
  void **ppvVar1;
  short sVar2;
  undefined8 *puVar3;
  int iVar4;
  int *piVar5;
  long *plVar6;
  long lVar7;
  uv__mmsghdr *puVar8;
  ulong uVar9;
  undefined4 uVar10;
  ulong uVar11;
  msghdr h;
  uv__mmsghdr local_538 [20];
  
  uv_once(&once,uv__udp_mmsg_init);
  if (uv__sendmmsg_avail == '\0') {
    plVar6 = (long *)handle->write_queue[0];
    if (handle->write_queue == (void **)plVar6) {
      return;
    }
    do {
      if (plVar6 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                      ,0x1a2,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_538[0].msg_hdr.msg_control = (void *)0x0;
      local_538[0].msg_hdr.msg_controllen = 0;
      local_538[0].msg_hdr.msg_iov = (iovec *)0x0;
      local_538[0].msg_hdr.msg_iovlen = 0;
      local_538[0].msg_hdr.msg_namelen = 0;
      local_538[0].msg_hdr._12_4_ = 0;
      local_538[0].msg_hdr.msg_flags = 0;
      local_538[0].msg_hdr._52_4_ = 0;
      sVar2 = (short)plVar6[2];
      if (sVar2 == 0) {
        local_538[0].msg_hdr.msg_name = (long *)0x0;
        local_538[0].msg_hdr.msg_namelen = 0;
        local_538[0].msg_hdr._12_4_ = 0;
      }
      else {
        local_538[0].msg_hdr.msg_name = plVar6 + 2;
        if (sVar2 == 1) {
          local_538[0].msg_hdr.msg_namelen = 0x6e;
          local_538[0].msg_hdr._12_4_ = 0;
        }
        else if (sVar2 == 2) {
          local_538[0].msg_hdr.msg_namelen = 0x10;
          local_538[0].msg_hdr._12_4_ = 0;
        }
        else {
          if (sVar2 != 10) {
            __assert_fail("0 && \"unsupported address family\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                          ,0x1b4,"void uv__udp_sendmsg(uv_udp_t *)");
          }
          local_538[0].msg_hdr.msg_namelen = 0x1c;
          local_538[0].msg_hdr._12_4_ = 0;
        }
      }
      local_538[0].msg_hdr.msg_iov = (iovec *)plVar6[0x13];
      local_538[0].msg_hdr.msg_iovlen = (size_t)*(uint *)(plVar6 + 0x12);
      do {
        lVar7 = sendmsg((handle->io_watcher).fd,(msghdr *)local_538,0);
        if (lVar7 != -1) goto LAB_00189d41;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
      } while ((long)iVar4 == 4);
      if (iVar4 == 0xb) {
        return;
      }
      if (iVar4 == 0x69) {
        return;
      }
      lVar7 = -(long)iVar4;
LAB_00189d41:
      plVar6[0x14] = lVar7;
      *(long *)plVar6[1] = *plVar6;
      *(long *)(*plVar6 + 8) = plVar6[1];
      *plVar6 = (long)handle->write_completed_queue;
      puVar3 = (undefined8 *)handle->write_completed_queue[1];
      plVar6[1] = (long)puVar3;
      *puVar3 = plVar6;
      handle->write_completed_queue[1] = plVar6;
      uv__io_feed(handle->loop,&handle->io_watcher);
      plVar6 = (long *)handle->write_queue[0];
      if (handle->write_queue == (void **)plVar6) {
        return;
      }
    } while( true );
  }
  ppvVar1 = handle->write_queue;
  if (ppvVar1 == (void **)handle->write_queue[0]) {
    return;
  }
  do {
    plVar6 = (long *)*ppvVar1;
    if ((void **)plVar6 == ppvVar1) {
      uVar11 = 0;
    }
    else {
      puVar8 = local_538;
      uVar9 = 0;
      do {
        if (plVar6 == (long *)0x0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                        ,0x148,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        *(long *)((long)puVar8 + 0x30) = 0;
        *(long *)((long)puVar8 + 0x38) = 0;
        *(long *)((long)puVar8 + 0x20) = 0;
        *(long *)((long)puVar8 + 0x28) = 0;
        *(long *)((long)puVar8 + 0x10) = 0;
        *(long *)((long)puVar8 + 0x18) = 0;
        *(long *)puVar8 = 0;
        *(long *)((long)puVar8 + 8) = 0;
        sVar2 = (short)plVar6[2];
        if (sVar2 == 0) {
          *(long *)puVar8 = 0;
          uVar10 = 0;
        }
        else {
          *(long **)puVar8 = plVar6 + 2;
          if (sVar2 == 1) {
            uVar10 = 0x6e;
          }
          else {
            uVar10 = 0x1c;
            if (sVar2 != 10) {
              if (sVar2 != 2) {
                __assert_fail("0 && \"unsupported address family\"",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                              ,0x15a,"void uv__udp_sendmmsg(uv_udp_t *)");
              }
              uVar10 = 0x10;
            }
          }
        }
        *(undefined4 *)((long)puVar8 + 8) = uVar10;
        *(long *)((long)puVar8 + 0x10) = plVar6[0x13];
        *(ulong *)((long)puVar8 + 0x18) = (ulong)*(uint *)(plVar6 + 0x12);
        uVar11 = uVar9 + 1;
        if (0x12 < uVar9) break;
        plVar6 = (long *)*plVar6;
        puVar8 = (uv__mmsghdr *)((long)puVar8 + 0x40);
        uVar9 = uVar11;
      } while ((void **)plVar6 != ppvVar1);
    }
    do {
      iVar4 = uv__sendmmsg((handle->io_watcher).fd,local_538,(uint)uVar11,0);
      if (iVar4 != -1) break;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    if (iVar4 < 1) {
      piVar5 = __errno_location();
      iVar4 = *piVar5;
      if ((long)iVar4 == 0xb) {
        return;
      }
      if (iVar4 == 0x69) {
        return;
      }
      plVar6 = (long *)*ppvVar1;
      if ((void **)plVar6 != ppvVar1 && uVar11 != 0) {
        uVar9 = 1;
        goto LAB_00189de1;
      }
      break;
    }
    plVar6 = (long *)*ppvVar1;
    if ((void **)plVar6 != ppvVar1 && uVar11 != 0) {
      uVar9 = 1;
      do {
        if (plVar6 == (long *)0x0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                        ,0x17b,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        plVar6[0x14] = *(long *)(plVar6[0x13] + 8);
        *(long *)plVar6[1] = *plVar6;
        *(long *)(*plVar6 + 8) = plVar6[1];
        *plVar6 = (long)handle->write_completed_queue;
        puVar3 = (undefined8 *)handle->write_completed_queue[1];
        plVar6[1] = (long)puVar3;
        *puVar3 = plVar6;
        handle->write_completed_queue[1] = plVar6;
        plVar6 = (long *)handle->write_queue[0];
      } while ((uVar9 < uVar11) && (uVar9 = uVar9 + 1, (void **)plVar6 != ppvVar1));
    }
  } while (ppvVar1 != (void **)plVar6);
  goto LAB_00189c48;
  while( true ) {
    plVar6 = (long *)*plVar6;
    uVar9 = uVar9 + 1;
    if ((void **)plVar6 == ppvVar1) break;
LAB_00189de1:
    if (plVar6 == (long *)0x0) {
      __assert_fail("q != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                    ,0x16c,"void uv__udp_sendmmsg(uv_udp_t *)");
    }
    plVar6[0x14] = -(long)iVar4;
    *(long *)plVar6[1] = *plVar6;
    *(long *)(*plVar6 + 8) = plVar6[1];
    *plVar6 = (long)handle->write_completed_queue;
    puVar3 = (undefined8 *)handle->write_completed_queue[1];
    plVar6[1] = (long)puVar3;
    *puVar3 = plVar6;
    handle->write_completed_queue[1] = plVar6;
    if (uVar11 <= uVar9) break;
  }
LAB_00189c48:
  uv__io_feed(handle->loop,&handle->io_watcher);
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct msghdr h;
  QUEUE* q;
  ssize_t size;

#if HAVE_MMSG
  uv_once(&once, uv__udp_mmsg_init);
  if (uv__sendmmsg_avail) {
    uv__udp_sendmmsg(handle);
    return;
  }
#endif

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}